

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O3

void __thiscall DiscreteSpaceInformation::~DiscreteSpaceInformation(DiscreteSpaceInformation *this)

{
  bool bVar1;
  ulong uVar2;
  pointer ppiVar3;
  ulong uVar4;
  pointer ppiVar5;
  
  this->_vptr_DiscreteSpaceInformation = (_func_int **)&PTR___cxa_pure_virtual_0010ec70;
  ppiVar5 = (this->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppiVar3 = (this->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppiVar3 != ppiVar5) {
    uVar2 = 0;
    uVar4 = 1;
    do {
      if (ppiVar5[uVar2] != (int *)0x0) {
        operator_delete__(ppiVar5[uVar2]);
        ppiVar5 = (this->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppiVar3 = (this->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      bVar1 = uVar4 < (ulong)((long)ppiVar3 - (long)ppiVar5 >> 3);
      uVar2 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar1);
  }
  if (ppiVar5 != (pointer)0x0) {
    operator_delete(ppiVar5,(long)(this->StateID2IndexMapping).
                                  super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppiVar5);
    return;
  }
  return;
}

Assistant:

virtual ~DiscreteSpaceInformation()
    {
        SBPL_PRINTF("destroying discretespaceinformation\n");
        for (unsigned int i = 0; i < StateID2IndexMapping.size(); ++i) {
            if (StateID2IndexMapping[i] != NULL) delete[] StateID2IndexMapping[i];
        }
        SBPL_FCLOSE(fDeb);
    }